

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O3

void __thiscall
gmlc::concurrency::
DelayedDestructor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~DelayedDestructor
          (DelayedDestructor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  _Manager_type p_Var1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  timespec local_28;
  
  if ((this->ElementsToBeDestroyed).
      super__Vector_base<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->ElementsToBeDestroyed).
      super__Vector_base<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar4 = 0;
    do {
      destroyObjects(this);
      if ((this->ElementsToBeDestroyed).
          super__Vector_base<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->ElementsToBeDestroyed).
          super__Vector_base<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (3 < uVar4) {
          destroyObjects(this);
          break;
        }
        if ((uVar4 & 1) == 0) {
          sched_yield();
        }
        else {
          local_28.tv_sec = 0;
          local_28.tv_nsec = 100000000;
          do {
            iVar2 = nanosleep(&local_28,&local_28);
            if (iVar2 != -1) break;
            piVar3 = __errno_location();
          } while (*piVar3 == 4);
        }
      }
      uVar4 = uVar4 + 1;
    } while ((this->ElementsToBeDestroyed).
             super__Vector_base<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->ElementsToBeDestroyed).
             super__Vector_base<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var1 = (this->callBeforeDeleteFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->callBeforeDeleteFunction,
              (_Any_data *)&this->callBeforeDeleteFunction,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->ElementsToBeDestroyed);
  return;
}

Assistant:

~DelayedDestructor()
    {
        try {
            int ii = 0;
            while (!ElementsToBeDestroyed.empty()) {
                ++ii;
                destroyObjects();
                if (!ElementsToBeDestroyed.empty()) {
#ifdef ENABLE_TRIPWIRE
                    // short circuit if the tripline was triggered
                    if (tripDetect.isTripped()) {
                        return;
                    }
#endif
                    if (ii > 4) {
                        destroyObjects();
                        break;
                    }
                    if (ii % 2 == 0) {
                        std::this_thread::sleep_for(
                            std::chrono::milliseconds(100));
                    } else {
                        std::this_thread::yield();
                    }
                }
            }
        }
        catch (...) {
        }
    }